

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeOpen(sqlite3_vfs *pVfs,char *zFilename,sqlite3 *db,Btree **ppBtree,int flags,
                    int vfsFlags)

{
  char cVar1;
  sqlite3_file *psVar2;
  PCache *pPVar3;
  sqlite3_io_methods *psVar4;
  sqlite3_pcache *psVar5;
  bool bVar6;
  long lVar7;
  int iVar8;
  Btree *p;
  BtShared *pBVar9;
  char *pcVar10;
  char *pcVar11;
  Pager *pPVar12;
  ulong uVar13;
  sqlite3_mutex *psVar14;
  sqlite3_mutex *psVar15;
  void *pvVar16;
  uint uVar17;
  uint uVar18;
  Btree **ppBVar19;
  code *pcVar20;
  Btree *pBVar21;
  size_t __n;
  long lVar22;
  Btree *pBVar23;
  Btree *pBVar24;
  Btree *pBVar25;
  byte bVar26;
  uint uVar27;
  uint uVar28;
  int iVar29;
  long lVar30;
  char *pcVar31;
  u8 uVar32;
  bool bVar33;
  bool bVar34;
  uchar zDbHeader [100];
  sqlite3_mutex *local_110;
  sqlite3_mutex *local_108;
  uint local_e4;
  byte local_d4;
  u8 local_d0;
  char *local_c8;
  char *local_c0;
  uint local_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  ulong local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  
  if (zFilename == (char *)0x0) {
LAB_0012b9f0:
    bVar33 = true;
    if (db->temp_store != '\x02') goto LAB_0012ba07;
LAB_0012b9fa:
    local_e4 = flags | 2;
    uVar17 = 1;
  }
  else {
    cVar1 = *zFilename;
    bVar33 = cVar1 == '\0';
    iVar8 = strcmp(zFilename,":memory:");
    if (iVar8 == 0) goto LAB_0012b9fa;
    if (cVar1 == '\0') goto LAB_0012b9f0;
    bVar33 = false;
LAB_0012ba07:
    uVar17 = (vfsFlags & 0x80U) >> 7;
    local_e4 = flags | (vfsFlags & 0x80U) >> 6;
  }
  uVar27 = vfsFlags & 0xfffffcffU | 0x200;
  if (uVar17 == 0 && !bVar33) {
    uVar27 = vfsFlags;
  }
  if ((vfsFlags & 0x100U) == 0) {
    uVar27 = vfsFlags;
  }
  p = (Btree *)sqlite3Malloc(0x48);
  iVar8 = 7;
  if (p == (Btree *)0x0) {
    return 7;
  }
  p->pPrev = (Btree *)0x0;
  (p->lock).pBtree = (Btree *)0x0;
  (p->lock).iTable = 0;
  (p->lock).eLock = '\0';
  *(undefined3 *)&(p->lock).field_0xd = 0;
  (p->lock).pNext = (BtLock *)0x0;
  *(undefined8 *)&p->nBackup = 0;
  p->pNext = (Btree *)0x0;
  p->pBt = (BtShared *)0x0;
  p->inTrans = '\0';
  p->sharable = '\0';
  p->locked = '\0';
  p->field_0x13 = 0;
  p->wantToLock = 0;
  p->db = db;
  (p->lock).pBtree = p;
  (p->lock).iTable = 1;
  local_d4 = (byte)uVar17;
  if ((!bVar33) && ((uVar27 >> 0x11 & 1) != 0 && ((uVar27 & 0x40) == 0 & local_d4) == 0)) {
    iVar29 = pVfs->mxPathname + 1;
    pcVar10 = (char *)sqlite3Malloc(iVar29);
    p->sharable = '\x01';
    if (pcVar10 == (char *)0x0) {
LAB_0012bd69:
      sqlite3_free(p);
      return iVar8;
    }
    if (local_d4 == 0) {
      *pcVar10 = '\0';
      iVar8 = (*pVfs->xFullPathname)(pVfs,zFilename,iVar29,pcVar10);
      if (iVar8 != 0) {
        sqlite3_free(pcVar10);
        goto LAB_0012bd69;
      }
    }
    else {
      if (zFilename == (char *)0x0) {
        __n = 1;
      }
      else {
        lVar22 = -1;
        do {
          lVar30 = lVar22 + 1;
          lVar22 = lVar22 + 1;
        } while (zFilename[lVar30] != '\0');
        __n = (ulong)((uint)lVar22 & 0x3fffffff) + 1;
      }
      memcpy(pcVar10,zFilename,__n);
    }
    bVar33 = true;
    if (sqlite3Config.bCoreMutex == 0) {
      local_108 = (sqlite3_mutex *)0x0;
      bVar6 = true;
      bVar34 = true;
      local_110 = (sqlite3_mutex *)0x0;
      pBVar9 = sqlite3SharedCacheList;
    }
    else {
      local_110 = (*sqlite3Config.mutex.xMutexAlloc)(4);
      bVar34 = local_110 == (sqlite3_mutex *)0x0;
      if (!bVar34) {
        (*sqlite3Config.mutex.xMutexEnter)(local_110);
      }
      if ((sqlite3Config.bCoreMutex == 0) ||
         (local_108 = (*sqlite3Config.mutex.xMutexAlloc)(2), local_108 == (sqlite3_mutex *)0x0)) {
        local_108 = (sqlite3_mutex *)0x0;
        bVar6 = true;
        pBVar9 = sqlite3SharedCacheList;
      }
      else {
        (*sqlite3Config.mutex.xMutexEnter)(local_108);
        bVar6 = false;
        pBVar9 = sqlite3SharedCacheList;
      }
    }
joined_r0x0012c088:
    if (pBVar9 != (BtShared *)0x0) {
      pPVar12 = pBVar9->pPager;
      iVar8 = strcmp(pcVar10,pPVar12->zFilename);
      if ((iVar8 != 0) || (pPVar12->pVfs != pVfs)) goto LAB_0012c0b2;
      lVar22 = (long)db->nDb;
      if (0 < lVar22) {
        uVar13 = lVar22 + 1;
        ppBVar19 = &db->aDb[lVar22 + -1].pBt;
        do {
          if ((*ppBVar19 != (Btree *)0x0) && ((*ppBVar19)->pBt == pBVar9)) {
            if (!bVar6) {
              (*sqlite3Config.mutex.xMutexLeave)(local_108);
            }
            if (!bVar34) {
              (*sqlite3Config.mutex.xMutexLeave)(local_110);
            }
            sqlite3_free(pcVar10);
            sqlite3_free(p);
            return 0x13;
          }
          uVar13 = uVar13 - 1;
          ppBVar19 = ppBVar19 + -4;
        } while (1 < uVar13);
      }
      p->pBt = pBVar9;
      pBVar9->nRef = pBVar9->nRef + 1;
      bVar33 = false;
    }
    if (!bVar6) {
      (*sqlite3Config.mutex.xMutexLeave)(local_108);
    }
    sqlite3_free(pcVar10);
    if (bVar33) goto LAB_0012baab;
    goto LAB_0012c0f0;
  }
  local_110 = (sqlite3_mutex *)0x0;
LAB_0012baab:
  pBVar9 = (BtShared *)sqlite3Malloc(0x88);
  if (pBVar9 == (BtShared *)0x0) {
    iVar8 = 7;
  }
  else {
    memset(pBVar9,0,0x88);
    local_98 = CONCAT44(local_98._4_4_,0x400);
    uVar17 = 0x30;
    if (0x30 < pVfs->szOsFile) {
      uVar17 = pVfs->szOsFile + 7U & 0xfffffff8;
    }
    pBVar9->pPager = (Pager *)0x0;
    uVar18 = local_e4 & 2;
    local_c0 = zFilename;
    if (uVar18 == 0) {
      if (zFilename == (char *)0x0) {
        local_c0 = (char *)0x0;
        bVar33 = true;
LAB_0012bd93:
        local_d0 = '\0';
        goto LAB_0012bdbf;
      }
      if (*zFilename == '\0') {
        bVar33 = false;
        goto LAB_0012bd93;
      }
      iVar8 = pVfs->mxPathname;
      pcVar10 = (char *)sqlite3Malloc(iVar8 * 2 + 2);
      if (pcVar10 == (char *)0x0) {
LAB_0012bd76:
        iVar8 = 7;
      }
      else {
        *pcVar10 = '\0';
        iVar8 = (*pVfs->xFullPathname)(pVfs,zFilename,iVar8 + 1,pcVar10);
        lVar22 = 0;
        do {
          pcVar11 = pcVar10 + lVar22;
          lVar22 = lVar22 + 1;
        } while (*pcVar11 != '\0');
        lVar30 = -1;
        do {
          lVar7 = lVar30 + 1;
          lVar30 = lVar30 + 1;
        } while (zFilename[lVar7] != '\0');
        uVar28 = (uint)lVar30 & 0x3fffffff;
        local_c8 = zFilename + (ulong)uVar28 + 1;
        pcVar11 = local_c8;
        if (*local_c8 == '\0') {
          iVar29 = uVar28 + (int)zFilename;
        }
        else {
          do {
            lVar30 = 0;
            do {
              lVar7 = lVar30 + 1;
              lVar30 = lVar30 + 1;
            } while (pcVar11[lVar7] != '\0');
            uVar28 = (uint)lVar30 & 0x3fffffff;
            pcVar31 = pcVar11 + (ulong)uVar28 + 1;
            lVar30 = -1;
            do {
              lVar7 = lVar30 + (ulong)uVar28 + 2;
              lVar30 = lVar30 + 1;
            } while (pcVar11[lVar7] != '\0');
            uVar28 = (uint)lVar30 & 0x3fffffff;
            pcVar11 = pcVar31 + (ulong)uVar28 + 1;
          } while (pcVar31[(ulong)uVar28 + 1] != '\0');
          iVar29 = (int)pcVar31 + uVar28;
        }
        if (iVar8 == 0) {
          uVar28 = (int)lVar22 - 1U & 0x3fffffff;
          if ((int)(uVar28 + 8) <= pVfs->mxPathname) {
            iVar8 = (iVar29 - (int)local_c8) + 2;
            bVar33 = false;
            local_d0 = '\0';
            goto LAB_0012bdcb;
          }
          iVar8 = 0xe;
          sqlite3_log(0xe,"cannot open file at line %d of [%.10s]",0xa79a,
                      "118a3b35693b134d56ebd780123b7fd6f1497668");
        }
        sqlite3_free(pcVar10);
      }
    }
    else {
      if (zFilename == (char *)0x0) {
        local_d0 = '\x01';
        bVar33 = true;
        local_c0 = (char *)0x0;
LAB_0012bdbf:
        uVar28 = 0;
        pcVar10 = (char *)0x0;
        local_c8 = (char *)0x0;
        iVar8 = 0;
      }
      else {
        if (*zFilename == '\0') {
          local_d0 = '\x01';
          bVar33 = false;
          goto LAB_0012bdbf;
        }
        lVar22 = 0;
        do {
          lVar30 = lVar22 + 1;
          lVar22 = lVar22 + 1;
        } while (zFilename[lVar30] != '\0');
        uVar28 = ((uint)lVar22 & 0x3fffffff) + 1;
        pcVar10 = (char *)sqlite3Malloc(uVar28);
        if (pcVar10 == (char *)0x0) goto LAB_0012bd76;
        memcpy(pcVar10,zFilename,(ulong)uVar28);
        lVar22 = 0;
        do {
          pcVar11 = pcVar10 + lVar22;
          lVar22 = lVar22 + 1;
        } while (*pcVar11 != '\0');
        uVar28 = (int)lVar22 - 1U & 0x3fffffff;
        local_c0 = (char *)0x0;
        bVar33 = true;
        local_d0 = '\x01';
        local_c8 = (char *)0x0;
        iVar8 = 0;
      }
LAB_0012bdcb:
      iVar29 = (pVfs->szOsFile + 7U & 0xfffffff8) + uVar28 * 3 + uVar17 * 2 + iVar8 + 0x189;
      pPVar12 = (Pager *)sqlite3Malloc(iVar29);
      if (pPVar12 == (Pager *)0x0) {
        sqlite3_free(pcVar10);
        iVar8 = 7;
      }
      else {
        memset(pPVar12,0,(long)iVar29);
        pPVar12->pPCache = (PCache *)(pPVar12 + 1);
        pPVar12->fd = (sqlite3_file *)&pPVar12[1].jfd;
        pcVar11 = pPVar12[1].dbFileVers + (((long)pVfs->szOsFile + 7U & 0xfffffffffffffff8) - 0x34);
        pPVar12->sjfd = (sqlite3_file *)pcVar11;
        pPVar12->jfd = (sqlite3_file *)(pcVar11 + (int)uVar17);
        pcVar11 = pcVar11 + (int)uVar17 + (int)uVar17;
        pPVar12->zFilename = pcVar11;
        if (pcVar10 != (char *)0x0) {
          uVar13 = (ulong)uVar28;
          pPVar12->zJournal = pcVar11 + (int)(uVar28 + iVar8 + 1);
          memcpy(pcVar11,pcVar10,uVar13);
          if (iVar8 != 0) {
            memcpy(pPVar12->zFilename + (uVar28 + 1),local_c8,(long)iVar8);
          }
          memcpy(pPVar12->zJournal,pcVar10,uVar13);
          builtin_strncpy(pPVar12->zJournal + uVar13,"-journal",9);
          (pPVar12->zJournal + uVar13 + 8)[1] = '\0';
          pPVar12->zWal = pPVar12->zJournal + uVar13 + 9;
          memcpy(pPVar12->zJournal + uVar13 + 9,pcVar10,uVar13);
          builtin_strncpy(pPVar12->zWal + uVar13,"-wal",5);
          sqlite3_free(pcVar10);
        }
        pPVar12->pVfs = pVfs;
        pPVar12->vfsFlags = uVar27;
        if ((bVar33) || (*local_c0 == '\0')) {
          pPVar12->eState = '\x01';
          pPVar12->eLock = '\x04';
          bVar26 = (byte)uVar27 & 1;
          uVar32 = '\x01';
          bVar33 = false;
LAB_0012c25b:
          iVar8 = sqlite3PagerSetPagesize(pPVar12,(u32 *)&local_98,-1);
          if (iVar8 == 0) {
            pcVar20 = (_func_int_void_ptr_PgHdr_ptr *)0x0;
            if (uVar18 == 0) {
              pcVar20 = pagerStress;
            }
            pPVar3 = pPVar12->pPCache;
            pPVar3->szPage = 0;
            pPVar3->szExtra = 0;
            *(undefined8 *)&pPVar3->bPurgeable = 0;
            pPVar3->xStress = (_func_int_void_ptr_PgHdr_ptr *)0x0;
            pPVar3->pStress = (void *)0x0;
            pPVar3->pSynced = (PgHdr *)0x0;
            pPVar3->nRef = 0;
            pPVar3->szCache = 0;
            pPVar3->pCache = (sqlite3_pcache *)0x0;
            pPVar3->pPage1 = (PgHdr *)0x0;
            pPVar3->pDirty = (PgHdr *)0x0;
            pPVar3->pDirtyTail = (PgHdr *)0x0;
            pPVar3->szPage = (u32)local_98;
            pPVar3->szExtra = 0x78;
            pPVar3->bPurgeable = uVar18 >> 1 ^ 1;
            pPVar3->xStress = pcVar20;
            pPVar3->pStress = pPVar12;
            pPVar3->szCache = 100;
            pPVar12->useJournal = (byte)(local_e4 & 1) ^ 1;
            pPVar12->mxPgno = 0x3fffffff;
            pPVar12->tempFile = uVar32;
            pPVar12->exclusiveMode = uVar32;
            pPVar12->changeCountDone = uVar32;
            pPVar12->memDb = local_d0;
            pPVar12->readOnly = bVar26;
            pPVar12->noSync = uVar32;
            if (bVar33) {
              pPVar12->fullSync = '\x01';
              pPVar12->ckptSyncFlags = '\x02';
              pPVar12->walSyncFlags = '\"';
              pPVar12->syncFlags = '\x02';
            }
            pPVar12->nExtra = 0x78;
            pPVar12->journalSizeLimit = -1;
            setSectorSize(pPVar12);
            if ((local_e4 & 3) != 0) {
              pPVar12->journalMode = ((local_e4 & 1) == 0) * '\x02' + '\x02';
            }
            pPVar12->xReiniter = pageReinit;
            pBVar9->pPager = pPVar12;
            pPVar12->szMmap = db->szMmap;
            pagerFixMaplimit(pPVar12);
            local_48 = 0;
            uStack_40 = 0;
            local_58 = 0;
            uStack_50 = 0;
            local_68 = 0;
            uStack_60 = 0;
            local_78 = 0;
            uStack_70 = 0;
            local_88 = 0;
            uStack_80 = 0;
            local_98 = 0;
            uStack_90 = 0;
            local_38 = 0;
            psVar2 = pBVar9->pPager->fd;
            psVar4 = psVar2->pMethods;
            if (((psVar4 == (sqlite3_io_methods *)0x0) ||
                (iVar8 = (*psVar4->xRead)(psVar2,&local_98,100,0), iVar8 == 0x20a)) || (iVar8 == 0))
            {
              pBVar9->openFlags = (u8)local_e4;
              pBVar9->db = db;
              pPVar12 = pBVar9->pPager;
              pPVar12->xBusyHandler = btreeInvokeBusyHandler;
              pPVar12->pBusyHandlerArg = pBVar9;
              psVar4 = pPVar12->fd->pMethods;
              if (psVar4 != (sqlite3_io_methods *)0x0) {
                (*psVar4->xFileControl)(pPVar12->fd,0xf,&pPVar12->xBusyHandler);
                pPVar12 = pBVar9->pPager;
              }
              p->pBt = pBVar9;
              pBVar9->pCursor = (BtCursor *)0x0;
              pBVar9->pPage1 = (MemPage *)0x0;
              if (pPVar12->readOnly != '\0') {
                *(byte *)&pBVar9->btsFlags = (byte)pBVar9->btsFlags | 1;
              }
              iVar8 = (int)((local_88 & 0xff) << 8);
              uVar17 = (uint)local_88._1_1_ * 0x10000 + iVar8;
              pBVar9->pageSize = uVar17;
              if (((iVar8 + (uint)local_88._1_1_ * 0x10000) - 0x10001 < 0xffff01ff) ||
                 ((uVar17 + 0x1ffff & uVar17) != 0)) {
                pBVar9->pageSize = 0;
                uVar17 = 0;
                if (zFilename != (char *)0x0 && local_d4 == 0) {
                  pBVar9->autoVacuum = '\0';
                  pBVar9->incrVacuum = '\0';
                  uVar17 = 0;
                }
              }
              else {
                uVar17 = (uint)local_88._4_1_;
                pBVar9->btsFlags = pBVar9->btsFlags | 2;
                pBVar9->autoVacuum =
                     ((local_68._4_4_ >> 0x18 != 0 || (local_68 & 0xff000000000000) != 0) ||
                     (local_68 & 0xff0000000000) != 0) || (local_68 & 0xff00000000) != 0;
                pBVar9->incrVacuum =
                     (((uint)local_58 >> 0x18 != 0 || (local_58 & 0xff0000) != 0) ||
                     (local_58 & 0xff00) != 0) || (local_58 & 0xff) != 0;
              }
              iVar8 = sqlite3PagerSetPagesize(pPVar12,&pBVar9->pageSize,uVar17);
              if (iVar8 == 0) {
                pBVar9->usableSize = pBVar9->pageSize - uVar17;
                if (p->sharable != '\0') {
                  pBVar9->nRef = 1;
                  if (sqlite3Config.bCoreMutex != 0) {
                    psVar14 = (*sqlite3Config.mutex.xMutexAlloc)(2);
                    if (sqlite3Config.bCoreMutex != 0) {
                      psVar15 = (*sqlite3Config.mutex.xMutexAlloc)(0);
                      pBVar9->mutex = psVar15;
                      if (psVar15 == (sqlite3_mutex *)0x0) {
                        db->mallocFailed = '\0';
                        iVar8 = 7;
                        goto LAB_0012c2a6;
                      }
                    }
                    if (psVar14 != (sqlite3_mutex *)0x0) {
                      (*sqlite3Config.mutex.xMutexEnter)(psVar14);
                      pBVar9->pNext = sqlite3SharedCacheList;
                      sqlite3SharedCacheList = pBVar9;
                      (*sqlite3Config.mutex.xMutexLeave)(psVar14);
                      goto LAB_0012c0f0;
                    }
                  }
                  pBVar9->pNext = sqlite3SharedCacheList;
                  sqlite3SharedCacheList = pBVar9;
                }
LAB_0012c0f0:
                if ((p->sharable != '\0') && (0 < (long)db->nDb)) {
                  lVar22 = 0;
                  do {
                    pBVar25 = *(Btree **)((long)&db->aDb->pBt + lVar22);
                    if ((pBVar25 != (Btree *)0x0) && (pBVar25->sharable != '\0')) goto LAB_0012c130;
                    lVar22 = lVar22 + 0x20;
                  } while ((long)db->nDb * 0x20 != lVar22);
                }
                goto LAB_0012c68d;
              }
            }
            goto LAB_0012c2a6;
          }
        }
        else {
          local_9c = 0;
          iVar8 = (*pVfs->xOpen)(pVfs,pPVar12->zFilename,pPVar12->fd,uVar27 & 0x87f7f,
                                 (int *)&local_9c);
          bVar26 = (byte)(local_9c & 1);
          if (iVar8 == 0 && (local_9c & 1) == 0) {
            setSectorSize(pPVar12);
            uVar17 = pPVar12->sectorSize;
            if (0x400 < uVar17) {
              if (uVar17 < 0x2001) {
                local_98 = CONCAT44(local_98._4_4_,uVar17);
              }
              else {
                local_98 = CONCAT44(local_98._4_4_,0x2000);
              }
            }
            bVar26 = 0;
LAB_0012c258:
            bVar33 = true;
            uVar32 = '\0';
            goto LAB_0012c25b;
          }
          if (iVar8 == 0) goto LAB_0012c258;
        }
        psVar2 = pPVar12->fd;
        if (psVar2->pMethods != (sqlite3_io_methods *)0x0) {
          (*psVar2->pMethods->xClose)(psVar2);
          psVar2->pMethods = (sqlite3_io_methods *)0x0;
        }
        sqlite3_free(pPVar12);
      }
    }
LAB_0012c2a6:
    if (pBVar9->pPager != (Pager *)0x0) {
      sqlite3PagerClose(pBVar9->pPager);
    }
  }
  sqlite3_free(pBVar9);
  sqlite3_free(p);
  *ppBtree = (Btree *)0x0;
LAB_0012c2cb:
  if (local_110 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(local_110);
  }
  return iVar8;
LAB_0012c0b2:
  pBVar9 = pBVar9->pNext;
  goto joined_r0x0012c088;
LAB_0012c130:
  do {
    pBVar23 = pBVar25;
    pBVar25 = pBVar23->pPrev;
  } while (pBVar23->pPrev != (Btree *)0x0);
  lVar22 = 0x20;
  if (p->pBt < pBVar23->pBt) {
    ppBVar19 = &pBVar23->pPrev;
    pBVar21 = (Btree *)0x0;
    pBVar25 = p;
  }
  else {
    do {
      pBVar24 = pBVar23;
      pBVar25 = pBVar24->pNext;
      if (pBVar25 == (Btree *)0x0) {
        ppBVar19 = &pBVar24->pNext;
        pBVar23 = (Btree *)0x0;
        pBVar21 = pBVar24;
        pBVar25 = p;
        goto LAB_0012c682;
      }
      pBVar23 = pBVar25;
    } while (pBVar25->pBt < p->pBt);
    ppBVar19 = &pBVar24->pNext;
    p->pNext = pBVar25;
    lVar22 = 0x28;
    pBVar21 = p;
    pBVar23 = pBVar24;
  }
LAB_0012c682:
  *(Btree **)((long)&p->db + lVar22) = pBVar23;
  pBVar25->pPrev = pBVar21;
  *ppBVar19 = p;
LAB_0012c68d:
  *ppBtree = p;
  iVar8 = 0;
  pvVar16 = sqlite3BtreeSchema(p,0,(_func_void_void_ptr *)0x0);
  if (pvVar16 == (void *)0x0) {
    pPVar3 = p->pBt->pPager->pPCache;
    pPVar3->szCache = 2000;
    psVar5 = pPVar3->pCache;
    if (psVar5 != (sqlite3_pcache *)0x0) {
      (*sqlite3Config.pcache2.xCachesize)(psVar5,2000);
    }
  }
  goto LAB_0012c2cb;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeOpen(
  sqlite3_vfs *pVfs,      /* VFS to use for this b-tree */
  const char *zFilename,  /* Name of the file containing the BTree database */
  sqlite3 *db,            /* Associated database handle */
  Btree **ppBtree,        /* Pointer to new Btree object written here */
  int flags,              /* Options */
  int vfsFlags            /* Flags passed through to sqlite3_vfs.xOpen() */
){
  BtShared *pBt = 0;             /* Shared part of btree structure */
  Btree *p;                      /* Handle to return */
  sqlite3_mutex *mutexOpen = 0;  /* Prevents a race condition. Ticket #3537 */
  int rc = SQLITE_OK;            /* Result code from this function */
  u8 nReserve;                   /* Byte of unused space on each page */
  unsigned char zDbHeader[100];  /* Database header content */

  /* True if opening an ephemeral, temporary database */
  const int isTempDb = zFilename==0 || zFilename[0]==0;

  /* Set the variable isMemdb to true for an in-memory database, or 
  ** false for a file-based database.
  */
#ifdef SQLITE_OMIT_MEMORYDB
  const int isMemdb = 0;
#else
  const int isMemdb = (zFilename && strcmp(zFilename, ":memory:")==0)
                       || (isTempDb && sqlite3TempInMemory(db))
                       || (vfsFlags & SQLITE_OPEN_MEMORY)!=0;
#endif

  assert( db!=0 );
  assert( pVfs!=0 );
  assert( sqlite3_mutex_held(db->mutex) );
  assert( (flags&0xff)==flags );   /* flags fit in 8 bits */

  /* Only a BTREE_SINGLE database can be BTREE_UNORDERED */
  assert( (flags & BTREE_UNORDERED)==0 || (flags & BTREE_SINGLE)!=0 );

  /* A BTREE_SINGLE database is always a temporary and/or ephemeral */
  assert( (flags & BTREE_SINGLE)==0 || isTempDb );

  if( isMemdb ){
    flags |= BTREE_MEMORY;
  }
  if( (vfsFlags & SQLITE_OPEN_MAIN_DB)!=0 && (isMemdb || isTempDb) ){
    vfsFlags = (vfsFlags & ~SQLITE_OPEN_MAIN_DB) | SQLITE_OPEN_TEMP_DB;
  }
  p = sqlite3MallocZero(sizeof(Btree));
  if( !p ){
    return SQLITE_NOMEM;
  }
  p->inTrans = TRANS_NONE;
  p->db = db;
#ifndef SQLITE_OMIT_SHARED_CACHE
  p->lock.pBtree = p;
  p->lock.iTable = 1;
#endif

#if !defined(SQLITE_OMIT_SHARED_CACHE) && !defined(SQLITE_OMIT_DISKIO)
  /*
  ** If this Btree is a candidate for shared cache, try to find an
  ** existing BtShared object that we can share with
  */
  if( isTempDb==0 && (isMemdb==0 || (vfsFlags&SQLITE_OPEN_URI)!=0) ){
    if( vfsFlags & SQLITE_OPEN_SHAREDCACHE ){
      int nFullPathname = pVfs->mxPathname+1;
      char *zFullPathname = sqlite3Malloc(nFullPathname);
      MUTEX_LOGIC( sqlite3_mutex *mutexShared; )
      p->sharable = 1;
      if( !zFullPathname ){
        sqlite3_free(p);
        return SQLITE_NOMEM;
      }
      if( isMemdb ){
        memcpy(zFullPathname, zFilename, sqlite3Strlen30(zFilename)+1);
      }else{
        rc = sqlite3OsFullPathname(pVfs, zFilename,
                                   nFullPathname, zFullPathname);
        if( rc ){
          sqlite3_free(zFullPathname);
          sqlite3_free(p);
          return rc;
        }
      }
#if SQLITE_THREADSAFE
      mutexOpen = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_OPEN);
      sqlite3_mutex_enter(mutexOpen);
      mutexShared = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MASTER);
      sqlite3_mutex_enter(mutexShared);
#endif
      for(pBt=GLOBAL(BtShared*,sqlite3SharedCacheList); pBt; pBt=pBt->pNext){
        assert( pBt->nRef>0 );
        if( 0==strcmp(zFullPathname, sqlite3PagerFilename(pBt->pPager, 0))
                 && sqlite3PagerVfs(pBt->pPager)==pVfs ){
          int iDb;
          for(iDb=db->nDb-1; iDb>=0; iDb--){
            Btree *pExisting = db->aDb[iDb].pBt;
            if( pExisting && pExisting->pBt==pBt ){
              sqlite3_mutex_leave(mutexShared);
              sqlite3_mutex_leave(mutexOpen);
              sqlite3_free(zFullPathname);
              sqlite3_free(p);
              return SQLITE_CONSTRAINT;
            }
          }
          p->pBt = pBt;
          pBt->nRef++;
          break;
        }
      }
      sqlite3_mutex_leave(mutexShared);
      sqlite3_free(zFullPathname);
    }
#ifdef SQLITE_DEBUG
    else{
      /* In debug mode, we mark all persistent databases as sharable
      ** even when they are not.  This exercises the locking code and
      ** gives more opportunity for asserts(sqlite3_mutex_held())
      ** statements to find locking problems.
      */
      p->sharable = 1;
    }
#endif
  }
#endif
  if( pBt==0 ){
    /*
    ** The following asserts make sure that structures used by the btree are
    ** the right size.  This is to guard against size changes that result
    ** when compiling on a different architecture.
    */
    assert( sizeof(i64)==8 || sizeof(i64)==4 );
    assert( sizeof(u64)==8 || sizeof(u64)==4 );
    assert( sizeof(u32)==4 );
    assert( sizeof(u16)==2 );
    assert( sizeof(Pgno)==4 );
  
    pBt = sqlite3MallocZero( sizeof(*pBt) );
    if( pBt==0 ){
      rc = SQLITE_NOMEM;
      goto btree_open_out;
    }
    rc = sqlite3PagerOpen(pVfs, &pBt->pPager, zFilename,
                          EXTRA_SIZE, flags, vfsFlags, pageReinit);
    if( rc==SQLITE_OK ){
      sqlite3PagerSetMmapLimit(pBt->pPager, db->szMmap);
      rc = sqlite3PagerReadFileheader(pBt->pPager,sizeof(zDbHeader),zDbHeader);
    }
    if( rc!=SQLITE_OK ){
      goto btree_open_out;
    }
    pBt->openFlags = (u8)flags;
    pBt->db = db;
    sqlite3PagerSetBusyhandler(pBt->pPager, btreeInvokeBusyHandler, pBt);
    p->pBt = pBt;
  
    pBt->pCursor = 0;
    pBt->pPage1 = 0;
    if( sqlite3PagerIsreadonly(pBt->pPager) ) pBt->btsFlags |= BTS_READ_ONLY;
#ifdef SQLITE_SECURE_DELETE
    pBt->btsFlags |= BTS_SECURE_DELETE;
#endif
    pBt->pageSize = (zDbHeader[16]<<8) | (zDbHeader[17]<<16);
    if( pBt->pageSize<512 || pBt->pageSize>SQLITE_MAX_PAGE_SIZE
         || ((pBt->pageSize-1)&pBt->pageSize)!=0 ){
      pBt->pageSize = 0;
#ifndef SQLITE_OMIT_AUTOVACUUM
      /* If the magic name ":memory:" will create an in-memory database, then
      ** leave the autoVacuum mode at 0 (do not auto-vacuum), even if
      ** SQLITE_DEFAULT_AUTOVACUUM is true. On the other hand, if
      ** SQLITE_OMIT_MEMORYDB has been defined, then ":memory:" is just a
      ** regular file-name. In this case the auto-vacuum applies as per normal.
      */
      if( zFilename && !isMemdb ){
        pBt->autoVacuum = (SQLITE_DEFAULT_AUTOVACUUM ? 1 : 0);
        pBt->incrVacuum = (SQLITE_DEFAULT_AUTOVACUUM==2 ? 1 : 0);
      }
#endif
      nReserve = 0;
    }else{
      nReserve = zDbHeader[20];
      pBt->btsFlags |= BTS_PAGESIZE_FIXED;
#ifndef SQLITE_OMIT_AUTOVACUUM
      pBt->autoVacuum = (get4byte(&zDbHeader[36 + 4*4])?1:0);
      pBt->incrVacuum = (get4byte(&zDbHeader[36 + 7*4])?1:0);
#endif
    }
    rc = sqlite3PagerSetPagesize(pBt->pPager, &pBt->pageSize, nReserve);
    if( rc ) goto btree_open_out;
    pBt->usableSize = pBt->pageSize - nReserve;
    assert( (pBt->pageSize & 7)==0 );  /* 8-byte alignment of pageSize */
   
#if !defined(SQLITE_OMIT_SHARED_CACHE) && !defined(SQLITE_OMIT_DISKIO)
    /* Add the new BtShared object to the linked list sharable BtShareds.
    */
    if( p->sharable ){
      MUTEX_LOGIC( sqlite3_mutex *mutexShared; )
      pBt->nRef = 1;
      MUTEX_LOGIC( mutexShared = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MASTER);)
      if( SQLITE_THREADSAFE && sqlite3GlobalConfig.bCoreMutex ){
        pBt->mutex = sqlite3MutexAlloc(SQLITE_MUTEX_FAST);
        if( pBt->mutex==0 ){
          rc = SQLITE_NOMEM;
          db->mallocFailed = 0;
          goto btree_open_out;
        }
      }
      sqlite3_mutex_enter(mutexShared);
      pBt->pNext = GLOBAL(BtShared*,sqlite3SharedCacheList);
      GLOBAL(BtShared*,sqlite3SharedCacheList) = pBt;
      sqlite3_mutex_leave(mutexShared);
    }
#endif
  }

#if !defined(SQLITE_OMIT_SHARED_CACHE) && !defined(SQLITE_OMIT_DISKIO)
  /* If the new Btree uses a sharable pBtShared, then link the new
  ** Btree into the list of all sharable Btrees for the same connection.
  ** The list is kept in ascending order by pBt address.
  */
  if( p->sharable ){
    int i;
    Btree *pSib;
    for(i=0; i<db->nDb; i++){
      if( (pSib = db->aDb[i].pBt)!=0 && pSib->sharable ){
        while( pSib->pPrev ){ pSib = pSib->pPrev; }
        if( p->pBt<pSib->pBt ){
          p->pNext = pSib;
          p->pPrev = 0;
          pSib->pPrev = p;
        }else{
          while( pSib->pNext && pSib->pNext->pBt<p->pBt ){
            pSib = pSib->pNext;
          }
          p->pNext = pSib->pNext;
          p->pPrev = pSib;
          if( p->pNext ){
            p->pNext->pPrev = p;
          }
          pSib->pNext = p;
        }
        break;
      }
    }
  }
#endif
  *ppBtree = p;

btree_open_out:
  if( rc!=SQLITE_OK ){
    if( pBt && pBt->pPager ){
      sqlite3PagerClose(pBt->pPager);
    }
    sqlite3_free(pBt);
    sqlite3_free(p);
    *ppBtree = 0;
  }else{
    /* If the B-Tree was successfully opened, set the pager-cache size to the
    ** default value. Except, when opening on an existing shared pager-cache,
    ** do not change the pager-cache size.
    */
    if( sqlite3BtreeSchema(p, 0, 0)==0 ){
      sqlite3PagerSetCachesize(p->pBt->pPager, SQLITE_DEFAULT_CACHE_SIZE);
    }
  }
  if( mutexOpen ){
    assert( sqlite3_mutex_held(mutexOpen) );
    sqlite3_mutex_leave(mutexOpen);
  }
  return rc;
}